

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

void __thiscall camp::Property::~Property(Property *this)

{
  Property *this_local;
  
  (this->super_TagHolder)._vptr_TagHolder = (_func_int **)&PTR__Property_001fd218;
  detail::Getter<bool>::~Getter(&this->m_writable);
  detail::Getter<bool>::~Getter(&this->m_readable);
  std::__cxx11::string::~string((string *)&this->m_name);
  TagHolder::~TagHolder(&this->super_TagHolder);
  return;
}

Assistant:

Property::~Property()
{
}